

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas3.c
# Opt level: O2

int sp_dgemm(char *transa,char *transb,int m,int n,int k,double alpha,SuperMatrix *A,double *b,
            int ldb,double beta,double *c,int ldc)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    sp_dgemv(transa,alpha,A,b,1,beta,c,1);
    b = b + ldb;
    c = c + ldc;
  }
  return 0;
}

Assistant:

int
sp_dgemm(char *transa, char *transb, int m, int n, int k, 
         double alpha, SuperMatrix *A, double *b, int ldb, 
         double beta, double *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_dgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}